

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerApp::SyncNetworkData
          (Error *__return_storage_ptr__,CommissionerApp *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  int iVar4;
  CommissionerDataset commDataset;
  BbrDataset bbrDataset;
  PendingOperationalDataset pendingDataset;
  ActiveOperationalDataset activeDataset;
  ErrorCode local_2e0 [2];
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  CommissionerDataset *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  CommissionerDataset local_2a8;
  BbrDataset local_250;
  PendingOperationalDataset local_1e8;
  ActiveOperationalDataset local_108;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_2b0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_2b0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ActiveOperationalDataset::ActiveOperationalDataset(&local_108);
  PendingOperationalDataset::PendingOperationalDataset(&local_1e8);
  local_250.mTriHostname._M_dataplus._M_p = (pointer)&local_250.mTriHostname.field_2;
  local_250.mTriHostname._M_string_length = 0;
  local_250.mTriHostname.field_2._M_local_buf[0] = '\0';
  local_250.mRegistrarHostname._M_dataplus._M_p = (pointer)&local_250.mRegistrarHostname.field_2;
  local_250.mRegistrarHostname._M_string_length = 0;
  local_250.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_250.mRegistrarIpv6Addr.field_2;
  local_250.mRegistrarIpv6Addr._M_string_length = 0;
  local_250.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  local_250.mPresentFlags = 0;
  local_2a8.mBorderAgentLocator = 0;
  local_2a8.mSessionId = 0;
  local_2a8.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.mJoinerUdpPort = 0;
  local_2a8.mAeUdpPort = 0;
  local_2a8.mNmkpUdpPort = 0;
  local_2a8.mPresentFlags = 0;
  peVar3 = (this->mCommissioner).
           super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_250.mRegistrarIpv6Addr._M_dataplus._M_p = (pointer)paVar1;
  (*peVar3->_vptr_Commissioner[0x1a])(local_2e0,peVar3,&local_108,0xffff);
  __return_storage_ptr__->mCode = local_2e0[0];
  std::__cxx11::string::operator=((string *)this_00,(string *)local_2d8);
  EVar2 = __return_storage_ptr__->mCode;
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0]);
  }
  if (EVar2 == kNone) {
    peVar3 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_Commissioner[0x20])(local_2e0,peVar3,&local_1e8,0xffff);
    __return_storage_ptr__->mCode = local_2e0[0];
    std::__cxx11::string::operator=((string *)this_00,(string *)local_2d8);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_2d8[0] != local_2c8) {
      operator_delete(local_2d8[0]);
    }
    if (EVar2 == kNone) {
      local_2b8 = &this->mCommDataset;
      (*((this->mCommissioner).
         super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Commissioner[0x14])(local_2e0);
      __return_storage_ptr__->mCode = local_2e0[0];
      std::__cxx11::string::operator=((string *)this_00,(string *)local_2d8);
      EVar2 = __return_storage_ptr__->mCode;
      if (local_2d8[0] != local_2c8) {
        operator_delete(local_2d8[0]);
      }
      if (EVar2 == kNone) {
        peVar3 = (this->mCommissioner).
                 super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar3->_vptr_Commissioner[0x12])(local_2e0,peVar3,&local_2a8,0xffff);
        __return_storage_ptr__->mCode = local_2e0[0];
        std::__cxx11::string::operator=((string *)this_00,(string *)local_2d8);
        EVar2 = __return_storage_ptr__->mCode;
        if (local_2d8[0] != local_2c8) {
          operator_delete(local_2d8[0]);
        }
        if (EVar2 == kNone) {
          MergeDataset(local_2b8,&local_2a8);
          iVar4 = (*((this->mCommissioner).
                     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_vptr_Commissioner[10])();
          if ((char)iVar4 != '\0') {
            peVar3 = (this->mCommissioner).
                     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            (*peVar3->_vptr_Commissioner[0x18])(local_2e0,peVar3,&local_250,0xffff);
            __return_storage_ptr__->mCode = local_2e0[0];
            std::__cxx11::string::operator=((string *)this_00,(string *)local_2d8);
            EVar2 = __return_storage_ptr__->mCode;
            if (local_2d8[0] != local_2c8) {
              operator_delete(local_2d8[0]);
            }
            if (EVar2 != kNone) goto LAB_001a902d;
            BbrDataset::operator=(&this->mBbrDataset,&local_250);
          }
          (this->mActiveDataset).mActiveTimestamp = local_108.mActiveTimestamp;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mActiveDataset).mExtendedPanId,&local_108.mExtendedPanId);
          (this->mActiveDataset).mPanId = local_108.mPanId;
          std::__cxx11::string::_M_assign((string *)&(this->mActiveDataset).mNetworkName);
          (this->mActiveDataset).mChannel = local_108.mChannel;
          std::
          vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ::operator=(&(this->mActiveDataset).mChannelMask,&local_108.mChannelMask);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mActiveDataset).mMeshLocalPrefix,&local_108.mMeshLocalPrefix);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mActiveDataset).mNetworkMasterKey,&local_108.mNetworkMasterKey);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mActiveDataset).mPSKc,&local_108.mPSKc);
          (this->mActiveDataset).mSecurityPolicy.mRotationTime =
               local_108.mSecurityPolicy.mRotationTime;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mActiveDataset).mSecurityPolicy.mFlags,
                     &local_108.mSecurityPolicy.mFlags);
          (this->mActiveDataset).mPresentFlags = local_108.mPresentFlags;
          (this->mPendingDataset).super_ActiveOperationalDataset.mActiveTimestamp =
               local_1e8.super_ActiveOperationalDataset.mActiveTimestamp;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mPendingDataset).super_ActiveOperationalDataset.mExtendedPanId,
                     &local_1e8.super_ActiveOperationalDataset.mExtendedPanId);
          (this->mPendingDataset).super_ActiveOperationalDataset.mPanId =
               local_1e8.super_ActiveOperationalDataset.mPanId;
          std::__cxx11::string::_M_assign
                    ((string *)&(this->mPendingDataset).super_ActiveOperationalDataset.mNetworkName)
          ;
          (this->mPendingDataset).super_ActiveOperationalDataset.mChannel =
               local_1e8.super_ActiveOperationalDataset.mChannel;
          std::
          vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ::operator=(&(this->mPendingDataset).super_ActiveOperationalDataset.mChannelMask,
                      &local_1e8.super_ActiveOperationalDataset.mChannelMask);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mPendingDataset).super_ActiveOperationalDataset.mMeshLocalPrefix,
                     &local_1e8.super_ActiveOperationalDataset.mMeshLocalPrefix);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mPendingDataset).super_ActiveOperationalDataset.mNetworkMasterKey,
                     &local_1e8.super_ActiveOperationalDataset.mNetworkMasterKey);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mPendingDataset).super_ActiveOperationalDataset.mPSKc,
                     &local_1e8.super_ActiveOperationalDataset.mPSKc);
          (this->mPendingDataset).super_ActiveOperationalDataset.mSecurityPolicy.mRotationTime =
               local_1e8.super_ActiveOperationalDataset.mSecurityPolicy.mRotationTime;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(this->mPendingDataset).super_ActiveOperationalDataset.mSecurityPolicy.mFlags,
                     &local_1e8.super_ActiveOperationalDataset.mSecurityPolicy.mFlags);
          (this->mPendingDataset).super_ActiveOperationalDataset.mPresentFlags =
               local_1e8.super_ActiveOperationalDataset.mPresentFlags;
          *(undefined8 *)&(this->mPendingDataset).super_ActiveOperationalDataset.field_0xd4 =
               local_1e8._212_8_;
          *(undefined4 *)&(this->mPendingDataset).mPendingTimestamp.field_0x4 =
               local_1e8.mPendingTimestamp._4_4_;
        }
      }
    }
  }
LAB_001a902d:
  if (local_2a8.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.mNmkpSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a8.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.mAeSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a8.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.mSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.mRegistrarIpv6Addr._M_dataplus._M_p != paVar1) {
    operator_delete(local_250.mRegistrarIpv6Addr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.mRegistrarHostname._M_dataplus._M_p != &local_250.mRegistrarHostname.field_2) {
    operator_delete(local_250.mRegistrarHostname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.mTriHostname._M_dataplus._M_p != &local_250.mTriHostname.field_2) {
    operator_delete(local_250.mTriHostname._M_dataplus._M_p);
  }
  if (local_1e8.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1e8.super_ActiveOperationalDataset.mPSKc.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super_ActiveOperationalDataset.mPSKc.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1e8.super_ActiveOperationalDataset.mNetworkMasterKey.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super_ActiveOperationalDataset.mNetworkMasterKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1e8.super_ActiveOperationalDataset.mMeshLocalPrefix.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super_ActiveOperationalDataset.mMeshLocalPrefix.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_1e8.super_ActiveOperationalDataset.mChannelMask);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.super_ActiveOperationalDataset.mNetworkName._M_dataplus._M_p !=
      &local_1e8.super_ActiveOperationalDataset.mNetworkName.field_2) {
    operator_delete(local_1e8.super_ActiveOperationalDataset.mNetworkName._M_dataplus._M_p);
  }
  if (local_1e8.super_ActiveOperationalDataset.mExtendedPanId.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super_ActiveOperationalDataset.mExtendedPanId.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.mSecurityPolicy.mFlags.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mSecurityPolicy.mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mPSKc.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.mNetworkMasterKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mNetworkMasterKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.mMeshLocalPrefix.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mMeshLocalPrefix.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_108.mChannelMask);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.mNetworkName._M_dataplus._M_p != &local_108.mNetworkName.field_2) {
    operator_delete(local_108.mNetworkName._M_dataplus._M_p);
  }
  if (local_108.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mExtendedPanId.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SyncNetworkData(void)
{
    Error                     error;
    ActiveOperationalDataset  activeDataset;
    PendingOperationalDataset pendingDataset;
    BbrDataset                bbrDataset;
    CommissionerDataset       commDataset;

    SuccessOrExit(error = mCommissioner->GetActiveDataset(activeDataset, 0xFFFF));
    SuccessOrExit(error = mCommissioner->GetPendingDataset(pendingDataset, 0xFFFF));
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(mCommDataset));
    SuccessOrExit(error = mCommissioner->GetCommissionerDataset(commDataset, 0xFFFF));
    MergeDataset(mCommDataset, commDataset);

    if (IsCcmMode())
    {
        SuccessOrExit(error = mCommissioner->GetBbrDataset(bbrDataset, 0xFFFF));
        mBbrDataset = bbrDataset;
    }
    mActiveDataset  = activeDataset;
    mPendingDataset = pendingDataset;

exit:
    return error;
}